

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult GenValidUsageInputsXrEnumerateSceneComputeFeaturesMSFT
                   (XrInstance instance,XrSystemId systemId,uint32_t featureCapacityInput,
                   uint32_t *featureCountOutput,XrSceneComputeFeatureMSFT *features)

{
  ValidateXrHandleResult VVar1;
  GenValidUsageXrInstanceInfo *instance_info;
  allocator local_3b9;
  string local_3b8 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_398;
  allocator local_379;
  string local_378 [39];
  allocator local_351;
  string local_350 [39];
  allocator local_329;
  string local_328 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_308;
  allocator local_2e9;
  string local_2e8 [39];
  allocator local_2c1;
  string local_2c0 [32];
  GenValidUsageXrInstanceInfo *local_2a0;
  GenValidUsageXrInstanceInfo *gen_instance_info;
  string local_290 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_270;
  allocator local_251;
  string local_250 [39];
  allocator local_229;
  string local_228 [32];
  XrInstance_T local_208 [32];
  ostringstream local_1e8 [8];
  ostringstream oss;
  ValidateXrHandleResult handle_result;
  XrObjectType local_5c;
  undefined1 local_58 [8];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  XrResult xr_result;
  XrSceneComputeFeatureMSFT *features_local;
  uint32_t *featureCountOutput_local;
  uint32_t featureCapacityInput_local;
  XrSystemId systemId_local;
  XrInstance instance_local;
  
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
  systemId_local = (XrSystemId)instance;
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_58);
  local_5c = XR_OBJECT_TYPE_INSTANCE;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrInstance_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)local_58
             ,(XrInstance_T **)&systemId_local,&local_5c);
  VVar1 = VerifyXrInstanceHandle((XrInstance *)&systemId_local);
  if (VVar1 == VALIDATE_XR_HANDLE_SUCCESS) {
    instance_info =
         HandleInfoBase<XrInstance_T_*,_GenValidUsageXrInstanceInfo>::get
                   (&g_instance_info.
                     super_HandleInfoBase<XrInstance_T_*,_GenValidUsageXrInstanceInfo>,
                    (XrInstance_T *)systemId_local);
    local_2a0 = instance_info;
    if ((featureCapacityInput == 0) || (features != (XrSceneComputeFeatureMSFT *)0x0)) {
      if (featureCountOutput == (uint32_t *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_350,"VUID-xrEnumerateSceneComputeFeaturesMSFT-featureCountOutput-parameter"
                   ,&local_351);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_378,"xrEnumerateSceneComputeFeaturesMSFT",&local_379);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_398,
                   (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   local_58);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_3b8,
                   "Invalid NULL for uint32_t \"featureCountOutput\" which is not optional and must be non-NULL"
                   ,&local_3b9);
        CoreValidLogMessage(instance_info,(string *)local_350,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                            (string *)local_378,&local_398,(string *)local_3b8);
        std::__cxx11::string::~string(local_3b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                  (&local_398);
        std::__cxx11::string::~string(local_378);
        std::allocator<char>::~allocator((allocator<char> *)&local_379);
        std::__cxx11::string::~string(local_350);
        std::allocator<char>::~allocator((allocator<char> *)&local_351);
        instance_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
        gen_instance_info._4_4_ = 1;
      }
      else {
        instance_local._4_4_ =
             objects_info.
             super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        gen_instance_info._4_4_ = 1;
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2c0,"VUID-xrEnumerateSceneComputeFeaturesMSFT-features-parameter",&local_2c1)
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2e8,"xrEnumerateSceneComputeFeaturesMSFT",&local_2e9);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_308,
                 (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 local_58);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_328,
                 "Command xrEnumerateSceneComputeFeaturesMSFT param features is NULL, but featureCapacityInput is greater than 0"
                 ,&local_329);
      CoreValidLogMessage(instance_info,(string *)local_2c0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          (string *)local_2e8,&local_308,(string *)local_328);
      std::__cxx11::string::~string(local_328);
      std::allocator<char>::~allocator((allocator<char> *)&local_329);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_308);
      std::__cxx11::string::~string(local_2e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
      std::__cxx11::string::~string(local_2c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
      instance_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      gen_instance_info._4_4_ = 1;
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1e8);
    std::operator<<((ostream *)local_1e8,"Invalid XrInstance handle \"instance\" ");
    HandleToHexString<XrInstance_T*>(local_208);
    std::operator<<((ostream *)local_1e8,(string *)local_208);
    std::__cxx11::string::~string((string *)local_208);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_228,"VUID-xrEnumerateSceneComputeFeaturesMSFT-instance-parameter",&local_229);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_250,"xrEnumerateSceneComputeFeaturesMSFT",&local_251);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_270,
               (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               local_58);
    std::__cxx11::ostringstream::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,(string *)local_228,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,(string *)local_250,&local_270,local_290);
    std::__cxx11::string::~string((string *)local_290);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
              (&local_270);
    std::__cxx11::string::~string(local_250);
    std::allocator<char>::~allocator((allocator<char> *)&local_251);
    std::__cxx11::string::~string(local_228);
    std::allocator<char>::~allocator((allocator<char> *)&local_229);
    instance_local._4_4_ = XR_ERROR_HANDLE_INVALID;
    gen_instance_info._4_4_ = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1e8);
  }
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_58);
  return instance_local._4_4_;
}

Assistant:

XrResult GenValidUsageInputsXrEnumerateSceneComputeFeaturesMSFT(
XrInstance instance,
XrSystemId systemId,
uint32_t featureCapacityInput,
uint32_t* featureCountOutput,
XrSceneComputeFeatureMSFT* features) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(instance, XR_OBJECT_TYPE_INSTANCE);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrInstanceHandle(&instance);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrInstance handle \"instance\" ";
                oss << HandleToHexString(instance);
                CoreValidLogMessage(nullptr, "VUID-xrEnumerateSceneComputeFeaturesMSFT-instance-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrEnumerateSceneComputeFeaturesMSFT",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        GenValidUsageXrInstanceInfo *gen_instance_info = g_instance_info.get(instance);
        (void)gen_instance_info;  // quiet warnings
        // Optional array must be non-NULL when featureCapacityInput is non-zero
        if (0 != featureCapacityInput && nullptr == features) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrEnumerateSceneComputeFeaturesMSFT-features-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrEnumerateSceneComputeFeaturesMSFT",
                                objects_info,
                                "Command xrEnumerateSceneComputeFeaturesMSFT param features is NULL, but featureCapacityInput is greater than 0");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == featureCountOutput) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrEnumerateSceneComputeFeaturesMSFT-featureCountOutput-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrEnumerateSceneComputeFeaturesMSFT", objects_info,
                                "Invalid NULL for uint32_t \"featureCountOutput\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // NOTE: Can't validate "VUID-xrEnumerateSceneComputeFeaturesMSFT-featureCountOutput-parameter" type
                // NOTE: Can't validate "VUID-xrEnumerateSceneComputeFeaturesMSFT-features-parameter" output enum buffer
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}